

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_writer.cc
# Opt level: O2

Status __thiscall leveldb::log::Writer::AddRecord(Writer *this,Slice *slice)

{
  uint uVar1;
  WritableFile *pWVar2;
  int iVar3;
  size_t *in_RDX;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  char *__assertion;
  ulong uVar7;
  size_t length;
  WritableFile *local_48;
  ulong local_40;
  Status local_38;
  
  length = *in_RDX;
  uVar7 = in_RDX[1];
  this->dest_ = (WritableFile *)0x0;
  bVar4 = true;
  do {
    iVar3 = (int)slice->size_;
    if (0x8000 < iVar3) {
      __assertion = "leftover >= 0";
      uVar1 = 0x2d;
LAB_0010a59d:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_writer.cc"
                    ,uVar1,"Status leveldb::log::Writer::AddRecord(const Slice &)");
    }
    if (0x7ff9 < iVar3) {
      if (iVar3 != 0x8000) {
        local_40 = (ulong)(0x8000 - iVar3);
        local_48 = (WritableFile *)0x10e8fb;
        (**(code **)(*(long *)slice->data_ + 0x10))(&local_38,slice->data_,(Writer *)&local_48);
        Status::~Status(&local_38);
      }
      *(undefined4 *)&slice->size_ = 0;
      iVar3 = 0;
    }
    if ((int)(0x7ff9U - iVar3) < 0) {
      __assertion = "kBlockSize - block_offset_ - kHeaderSize >= 0";
      uVar1 = 0x39;
      goto LAB_0010a59d;
    }
    uVar5 = (ulong)(0x7ff9U - iVar3);
    uVar6 = uVar5;
    if (uVar7 < uVar5) {
      uVar6 = uVar7;
    }
    uVar1 = (uVar5 < uVar7) + 1;
    if (!bVar4) {
      uVar1 = 4 - (uVar5 < uVar7);
    }
    EmitPhysicalRecord((Writer *)&local_48,(RecordType)slice,(char *)(ulong)uVar1,length);
    pWVar2 = local_48;
    this->dest_ = local_48;
    local_48 = (WritableFile *)0x0;
    Status::~Status((Status *)&local_48);
    if (pWVar2 != (WritableFile *)0x0) {
      return (Status)(char *)this;
    }
    length = length + uVar6;
    bVar4 = false;
    uVar7 = uVar7 - uVar6;
    if (uVar7 == 0) {
      return (Status)(char *)this;
    }
  } while( true );
}

Assistant:

Status Writer::AddRecord(const Slice& slice) {
  const char* ptr = slice.data();
  size_t left = slice.size();

  // Fragment the record if necessary and emit it.  Note that if slice
  // is empty, we still want to iterate once to emit a single
  // zero-length record
  Status s;
  bool begin = true;
  do {
    const int leftover = kBlockSize - block_offset_;
    assert(leftover >= 0);
    if (leftover < kHeaderSize) {
      // Switch to a new block
      if (leftover > 0) {
        // Fill the trailer (literal below relies on kHeaderSize being 7)
        static_assert(kHeaderSize == 7, "");
        dest_->Append(Slice("\x00\x00\x00\x00\x00\x00", leftover));
      }
      block_offset_ = 0;
    }

    // Invariant: we never leave < kHeaderSize bytes in a block.
    assert(kBlockSize - block_offset_ - kHeaderSize >= 0);

    const size_t avail = kBlockSize - block_offset_ - kHeaderSize;
    const size_t fragment_length = (left < avail) ? left : avail;

    RecordType type;
    const bool end = (left == fragment_length);
    if (begin && end) {
      type = kFullType;
    } else if (begin) {
      type = kFirstType;
    } else if (end) {
      type = kLastType;
    } else {
      type = kMiddleType;
    }

    s = EmitPhysicalRecord(type, ptr, fragment_length);
    ptr += fragment_length;
    left -= fragment_length;
    begin = false;
  } while (s.ok() && left > 0);
  return s;
}